

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::getPartialStates(Synth *this,Bit8u *partialStates)

{
  PartialState PVar1;
  uint partialNum_00;
  PartialState partialState;
  uint partialNum;
  uint i;
  Bit8u packedStates;
  uint quartNum;
  Bit8u *partialStates_local;
  Synth *this_local;
  
  if ((this->opened & 1U) == 0) {
    memset(partialStates,0,(ulong)(this->partialCount + 3 >> 2));
  }
  else {
    for (i = 0; i << 2 < this->partialCount; i = i + 1) {
      partialNum._3_1_ = 0;
      for (partialState = PartialState_INACTIVE;
          (partialState < 4 &&
          (partialNum_00 = i * 4 + partialState, partialNum_00 < this->partialCount));
          partialState = partialState + PartialState_ATTACK) {
        PVar1 = getPartialState(this->partialManager,partialNum_00);
        partialNum._3_1_ =
             partialNum._3_1_ |
             (byte)((PVar1 & PartialState_RELEASE) << ((byte)(partialState << 1) & 0x1f));
      }
      partialStates[i] = partialNum._3_1_;
    }
  }
  return;
}

Assistant:

void Synth::getPartialStates(Bit8u *partialStates) const {
	if (!opened) {
		memset(partialStates, 0, ((partialCount + 3) >> 2));
		return;
	}
	for (unsigned int quartNum = 0; (4 * quartNum) < partialCount; quartNum++) {
		Bit8u packedStates = 0;
		for (unsigned int i = 0; i < 4; i++) {
			unsigned int partialNum = (4 * quartNum) + i;
			if (partialCount <= partialNum) break;
			PartialState partialState = getPartialState(partialManager, partialNum);
			packedStates |= (partialState & 3) << (2 * i);
		}
		partialStates[quartNum] = packedStates;
	}
}